

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_mtsafe_st_env_infrastructure.cpp
# Opt level: O2

timer_thread_stats_t __thiscall
so_5::env_infrastructures::simple_mtsafe::impl::
env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::fake_activity_tracker_t>::
query_timer_thread_stats
          (env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::fake_activity_tracker_t>
           *this)

{
  undefined4 extraout_var;
  size_t extraout_RDX;
  timer_thread_stats_t tVar1;
  
  std::mutex::lock(&(this->m_sync_objects).m_lock);
  tVar1.m_single_shot_count._0_4_ =
       (*((this->m_timer_manager)._M_t.
          super___uniq_ptr_impl<so_5::timer_manager_t,_std::default_delete<so_5::timer_manager_t>_>.
          _M_t.
          super__Tuple_impl<0UL,_so_5::timer_manager_t_*,_std::default_delete<so_5::timer_manager_t>_>
          .super__Head_base<0UL,_so_5::timer_manager_t_*,_false>._M_head_impl)->
         _vptr_timer_manager_t[7])();
  tVar1.m_single_shot_count._4_4_ = extraout_var;
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_sync_objects);
  tVar1.m_periodic_count = extraout_RDX;
  return tVar1;
}

Assistant:

timer_thread_stats_t
env_infrastructure_t< ACTIVITY_TRACKER >::query_timer_thread_stats()
	{
		std::lock_guard< std::mutex > lock( m_sync_objects.m_lock );

		return m_timer_manager->query_stats();
	}